

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O0

vector<CardType,_std::allocator<CardType>_> * __thiscall
Deck::populateDeck(vector<CardType,_std::allocator<CardType>_> *__return_storage_ptr__,Deck *this)

{
  int iVar1;
  int *piVar2;
  size_type sVar3;
  CardType local_38 [6];
  int local_20;
  undefined1 local_19;
  int i;
  Deck *this_local;
  vector<CardType,_std::allocator<CardType>_> *deck;
  
  local_19 = 0;
  _i = this;
  this_local = (Deck *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector(__return_storage_ptr__);
  for (local_20 = 0; iVar1 = local_20, piVar2 = getNumberOfCards(this), iVar1 < *piVar2 / 3;
      local_20 = local_20 + 1) {
    local_38[2] = 0;
    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
              (__return_storage_ptr__,local_38 + 2);
    local_38[1] = 1;
    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
              (__return_storage_ptr__,local_38 + 1);
    local_38[0] = CAVALRY;
    std::vector<CardType,_std::allocator<CardType>_>::emplace_back<CardType>
              (__return_storage_ptr__,local_38);
  }
  sVar3 = std::vector<CardType,_std::allocator<CardType>_>::size(__return_storage_ptr__);
  setNumberOfCards(this,(int)sVar3);
  return __return_storage_ptr__;
}

Assistant:

std::vector<CardType> Deck::populateDeck() {
    std::vector<CardType> deck = {};

    for (int i = 0; i < *Deck::getNumberOfCards() / 3; i++) {
        deck.emplace_back(CardType::INFANTRY);
        deck.emplace_back(CardType::ARTILLERY);
        deck.emplace_back(CardType::CAVALRY);
    }

    Deck::setNumberOfCards(deck.size());

    return deck;
}